

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::UniformCase::getUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *valuesDst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL)

{
  CallLogWrapper *this_00;
  pointer pBVar1;
  TestLog *pTVar2;
  _Alloc_hider _Var3;
  GLint location;
  uint uVar4;
  deUint32 err;
  GLenum GVar5;
  pointer pBVar6;
  int line;
  ulong uVar7;
  VarValue *value_00;
  char *msg;
  long lVar8;
  string queryName;
  VarValue value;
  GLint unit;
  bool local_254;
  long *local_238 [2];
  long local_228 [2];
  string local_218;
  undefined1 local_1f8 [4];
  GLfloat aGStack_1f4 [17];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  pBVar6 = (basicUniforms->
           super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(basicUniforms->
                          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6) >> 3) *
      0x286bca1b < 1) {
    local_254 = true;
  }
  else {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &this->super_CallLogWrapper;
    local_254 = true;
    lVar8 = 0;
    do {
      pBVar1 = pBVar6 + lVar8;
      if ((((this->super_CallLogWrapper).field_0x14 & 0x80) == 0) || (pBVar6[lVar8].elemNdx != 0)) {
        local_238[0] = local_228;
        _Var3._M_p = (pBVar1->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,_Var3._M_p,_Var3._M_p + (pBVar1->name)._M_string_length);
      }
      else {
        std::__cxx11::string::rfind((char)pBVar1,0x5b);
        std::__cxx11::string::substr((ulong)local_238,(ulong)pBVar1);
      }
      location = glu::CallLogWrapper::glGetUniformLocation(this_00,programGL,(GLchar *)local_238[0])
      ;
      uVar4 = glu::getDataTypeScalarSize(pBVar1->type);
      aGStack_1f4[0xb] = -4.3160208e+08;
      aGStack_1f4[0xc] = -4.3160208e+08;
      aGStack_1f4[0xd] = -4.3160208e+08;
      aGStack_1f4[0xe] = -4.3160208e+08;
      aGStack_1f4[7] = -4.3160208e+08;
      aGStack_1f4[8] = -4.3160208e+08;
      aGStack_1f4[9] = -4.3160208e+08;
      aGStack_1f4[10] = -4.3160208e+08;
      aGStack_1f4[3] = -4.3160208e+08;
      aGStack_1f4[4] = -4.3160208e+08;
      aGStack_1f4[5] = -4.3160208e+08;
      aGStack_1f4[6] = -4.3160208e+08;
      aGStack_1f4[1] = -4.3160208e+08;
      aGStack_1f4[2] = -4.3160208e+08;
      aGStack_1f4[0xf] = -4.3160208e+08;
      if (location == -1) {
        _local_1f8 = 0xcdcdcdcd00000000;
        std::
        vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ::push_back(valuesDst,(value_type *)local_1f8);
        if (pBVar1->isUsedInShader == true) {
          local_1b0 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"// FAILURE: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pBVar1->name)._M_dataplus._M_p,
                     (pBVar1->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," was used in shader, but has location -1",0x28);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          local_254 = false;
        }
      }
      else {
        local_1f8 = (undefined1  [4])pBVar1->type;
        aGStack_1f4[0] = -4.3160208e+08;
        if (((int)local_1f8 - TYPE_FLOAT < 4) ||
           ((int)local_1f8 - TYPE_FLOAT_MAT2 < 9 || (int)local_1f8 - TYPE_DOUBLE_MAT2 < 9)) {
          glu::CallLogWrapper::glGetUniformfv(this_00,programGL,location,(GLfloat *)(local_1f8 + 4))
          ;
          err = glu::CallLogWrapper::glGetError(this_00);
          line = 0x56e;
          msg = "glGetUniformfv(programGL, location, &value.val.floatV[0])";
LAB_00f7ff13:
          glu::checkError(err,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,line);
        }
        else {
          if ((int)local_1f8 - TYPE_INT < 4) {
            glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)(local_1f8 + 4))
            ;
            err = glu::CallLogWrapper::glGetError(this_00);
            line = 0x570;
            msg = "glGetUniformiv(programGL, location, &value.val.intV[0])";
            goto LAB_00f7ff13;
          }
          if ((int)local_1f8 - TYPE_BOOL < 4) {
            if (((this->super_CallLogWrapper).field_0x14 & 0x20) == 0) {
              glu::CallLogWrapper::glGetUniformfv
                        (this_00,programGL,location,(GLfloat *)(local_1f8 + 4));
              GVar5 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar5,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x57b);
              if (0 < (int)uVar4) {
                uVar7 = 0;
                do {
                  local_1f8[uVar7 + 4] = *(float *)(local_1f8 + uVar7 * 4 + 4) != 0.0;
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
            }
            else {
              glu::CallLogWrapper::glGetUniformiv
                        (this_00,programGL,location,(GLint *)(local_1f8 + 4));
              GVar5 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar5,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x575);
              if (0 < (int)uVar4) {
                uVar7 = 0;
                do {
                  local_1f8[uVar7 + 4] = *(int *)(local_1f8 + uVar7 * 4 + 4) != 0;
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
            }
          }
          else if ((int)local_1f8 - TYPE_SAMPLER_1D < 0x1e) {
            local_1b0._0_4_ = 0xffffffff;
            glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)local_1b0);
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glGetUniformiv(programGL, location, &unit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,0x583);
            aGStack_1f4[0] = (GLfloat)local_1b0._0_4_;
          }
        }
        std::
        vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ::push_back(valuesDst,(value_type *)local_1f8);
        local_1b0 = (undefined1  [8])pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"// Got ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pBVar1->name)._M_dataplus._M_p,
                   (pBVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," value ",7);
        apiVarValueStr_abi_cxx11_(&local_218,(Functional *)local_1f8,value_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      lVar8 = lVar8 + 1;
      pBVar6 = (basicUniforms->
               super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(basicUniforms->
                                         super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6)
                          >> 3) * 0x286bca1b);
  }
  return local_254;
}

Assistant:

bool UniformCase::getUniforms (vector<VarValue>& valuesDst, const vector<BasicUniform>& basicUniforms, const deUint32 programGL)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const string			queryName	= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				location	= glGetUniformLocation(programGL, queryName.c_str());
		const int				size		= glu::getDataTypeScalarSize(uniform.type);
		VarValue				value;

		deMemset(&value, 0xcd, sizeof(value)); // Initialize to known garbage.

		if (location == -1)
		{
			value.type = glu::TYPE_INVALID;
			valuesDst.push_back(value);
			if (uniform.isUsedInShader)
			{
				log << TestLog::Message << "// FAILURE: " << uniform.name << " was used in shader, but has location -1" << TestLog::EndMessage;
				success = false;
			}
			continue;
		}

		value.type = uniform.type;

		DE_STATIC_ASSERT(sizeof(GLint) == sizeof(value.val.intV[0]));
		DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(value.val.floatV[0]));

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
		{
			if (m_features & FEATURE_BOOLEANAPITYPE_INT)
			{
				GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.intV[i] != 0;
			}
			else // Default: use float.
			{
				GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.floatV[i] != 0.0f;
			}
		}
		else if (glu::isDataTypeSampler(uniform.type))
		{
			GLint unit = -1;
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &unit));
			value.val.samplerV.unit = unit;
		}
		else
			DE_ASSERT(false);

		valuesDst.push_back(value);

		log << TestLog::Message << "// Got " << uniform.name << " value " << apiVarValueStr(value) << TestLog::EndMessage;
	}

	return success;
}